

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall glslang::TParseVersions::doubleCheck(TParseVersions *this,TSourceLoc *loc,char *op)

{
  if (this->language != EShLangVertex) {
    profileRequires(this,loc,6,400,"GL_ARB_gpu_shader_fp64",op);
    return;
  }
  profileRequires(this,loc,6,400,2,&PTR_anon_var_dwarf_85f331_0089ac30,op);
  return;
}

Assistant:

void TParseVersions::doubleCheck(const TSourceLoc& loc, const char* op)
{

    //requireProfile(loc, ECoreProfile | ECompatibilityProfile, op);
    if (language == EShLangVertex) {
        const char* const f64_Extensions[] = {E_GL_ARB_gpu_shader_fp64, E_GL_ARB_vertex_attrib_64bit};
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 400, 2, f64_Extensions, op);
    } else
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 400, E_GL_ARB_gpu_shader_fp64, op);
}